

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

double Catch::Benchmark::Detail::erfc_inv(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = 1.0 - x;
  dVar1 = log((1.0 - dVar3) * (dVar3 + 1.0));
  if (dVar1 <= -6.25) {
    if (-0.0 < dVar1) {
      dVar2 = sqrt(-dVar1);
    }
    else {
      dVar2 = SQRT(-dVar1);
    }
    if (dVar1 <= -16.0) {
      dVar2 = dVar2 + -5.0;
      dVar1 = (((((((((((((((dVar2 * -2.7109920616438573e-11 + -2.555641816996525e-10) * dVar2 +
                           1.5076572693500548e-09) * dVar2 + -3.789465440126737e-09) * dVar2 +
                         7.61570120807834e-09) * dVar2 + -1.496002662714924e-08) * dVar2 +
                       2.914795345090108e-08) * dVar2 + -6.771199775845234e-08) * dVar2 +
                     2.2900482228026655e-07) * dVar2 + -9.9298272942317e-07) * dVar2 +
                   4.526062597223154e-06) * dVar2 + -1.968177810553167e-05) * dVar2 +
                 7.599527703001776e-05) * dVar2 + -0.00021503011930044477) * dVar2 +
               -0.00013871931833623122) * dVar2 + 1.0103004648645344) * dVar2 + 4.849906401408584;
    }
    else {
      dVar2 = dVar2 + -3.25;
      dVar1 = (((((((((((((((((dVar2 * 2.2137376921775787e-09 + 9.075656193888539e-08) * dVar2 +
                             -2.7517406297064545e-07) * dVar2 + 1.8239629214389228e-08) * dVar2 +
                           1.5027403968909828e-06) * dVar2 + -4.013867526981546e-06) * dVar2 +
                         2.9234449089955446e-06) * dVar2 + 1.2475304481671779e-05) * dVar2 +
                       -4.7318229009055734e-05) * dVar2 + 6.828485145957318e-05) * dVar2 +
                     2.4031110387097894e-05) * dVar2 + -0.0003550375203628475) * dVar2 +
                   0.0009532893797373805) * dVar2 + -0.0016882755560235047) * dVar2 +
                 0.002491442096107851) * dVar2 + -0.003751208507569241) * dVar2 +
               0.005370914553590064) * dVar2 + 1.0052589676941592) * dVar2 + 3.0838856104922208;
    }
  }
  else {
    dVar1 = -3.125 - dVar1;
    dVar1 = (((((((((((((((((((((dVar1 * -3.64441206401782e-21 + -1.6850591381820166e-19) * dVar1 +
                               1.28584807152564e-18) * dVar1 + 1.1157877678025181e-17) * dVar1 +
                             -1.333171662854621e-16) * dVar1 + 2.0972767875968562e-17) * dVar1 +
                           6.637638134358324e-15) * dVar1 + -4.054566272975207e-14) * dVar1 +
                         -8.151934197605472e-14) * dVar1 + 2.6335093153082323e-12) * dVar1 +
                       -1.2975133253453532e-11) * dVar1 + -5.415412054294628e-11) * dVar1 +
                     1.0512122733215323e-09) * dVar1 + -4.112633980346984e-09) * dVar1 +
                   -2.9070369957882005e-08) * dVar1 + 4.2347877827932404e-07) * dVar1 +
                 -1.3654692000834679e-06) * dVar1 + -1.3882523362786469e-05) * dVar1 +
               0.00018673420803405714) * dVar1 + -0.000740702534166267) * dVar1 +
             -0.006033670871430149) * dVar1 + 0.24015818242558962) * dVar1 + 1.6536545626831027;
  }
  return dVar3 * dVar1;
}

Assistant:

double erfc_inv(double x) {
                return erf_inv(1.0 - x);
            }